

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decoder_suite.cpp
# Opt level: O0

void compact_int64_suite::test_array32_int64_empty(void)

{
  bool bVar1;
  view_type *this;
  undefined4 local_68;
  value local_64 [2];
  undefined4 local_5c;
  value local_58 [2];
  undefined4 local_50;
  value local_4c [2];
  undefined4 local_44;
  value local_40 [2];
  undefined1 local_38 [8];
  decoder decoder;
  value_type input [5];
  
  decoder.current.view._M_str._4_1_ = 0;
  decoder.current.view._M_str._0_4_ = 0xce;
  trial::protocol::bintoken::detail::decoder::decoder<unsigned_char[5]>
            ((decoder *)local_38,(uchar (*) [5])&decoder.current.view._M_str);
  local_40[0] = trial::protocol::bintoken::detail::decoder::code((decoder *)local_38);
  local_44 = 0xce;
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,trial::protocol::bintoken::token::code::value,trial::protocol::bintoken::token::code::value>
            ("decoder.code()","token::code::array32_int64",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/decoder_suite.cpp"
             ,0xb67,"void compact_int64_suite::test_array32_int64_empty()",local_40,&local_44);
  local_4c[0] = trial::protocol::bintoken::detail::decoder::symbol((decoder *)local_38);
  local_50 = 7;
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,trial::protocol::bintoken::token::symbol::value,trial::protocol::bintoken::token::symbol::value>
            ("decoder.symbol()","token::symbol::array",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/decoder_suite.cpp"
             ,0xb68,"void compact_int64_suite::test_array32_int64_empty()",local_4c,&local_50);
  local_58[0] = trial::protocol::bintoken::detail::decoder::category((decoder *)local_38);
  local_5c = 2;
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,trial::protocol::bintoken::token::category::value,trial::protocol::bintoken::token::category::value>
            ("decoder.category()","token::category::data",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/decoder_suite.cpp"
             ,0xb69,"void compact_int64_suite::test_array32_int64_empty()",local_58,&local_5c);
  this = trial::protocol::bintoken::detail::decoder::literal((decoder *)local_38);
  bVar1 = std::
          basic_string_view<unsigned_char,_trial::protocol::core::detail::char_traits<unsigned_char>_>
          ::empty(this);
  boost::detail::test_impl
            ("decoder.literal().empty()",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/decoder_suite.cpp"
             ,0xb6a,"void compact_int64_suite::test_array32_int64_empty()",(bool)(-bVar1 & 1));
  trial::protocol::bintoken::detail::decoder::next((decoder *)local_38);
  local_64[0] = trial::protocol::bintoken::detail::decoder::code((decoder *)local_38);
  local_68 = 0;
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,trial::protocol::bintoken::token::code::value,trial::protocol::bintoken::token::code::value>
            ("decoder.code()","token::code::end",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/decoder_suite.cpp"
             ,0xb6c,"void compact_int64_suite::test_array32_int64_empty()",local_64,&local_68);
  return;
}

Assistant:

void test_array32_int64_empty()
{
    const value_type input[] = { token::code::array32_int64, 0x00, 0x00, 0x00, 0x00 };
    format::detail::decoder decoder(input);
    TRIAL_PROTOCOL_TEST_EQUAL(decoder.code(), token::code::array32_int64);
    TRIAL_PROTOCOL_TEST_EQUAL(decoder.symbol(), token::symbol::array);
    TRIAL_PROTOCOL_TEST_EQUAL(decoder.category(), token::category::data);
    TRIAL_PROTOCOL_TEST(decoder.literal().empty());
    decoder.next();
    TRIAL_PROTOCOL_TEST_EQUAL(decoder.code(), token::code::end);
}